

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  bool bVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  size_t *psVar17;
  long lVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1d0;
  size_t local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  undefined1 local_f8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar28._8_8_ = 0;
  auVar28._0_4_ =
       (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.super_Geometry
       .time_range.lower;
  auVar28._4_4_ =
       (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.super_Geometry
       .time_range.upper;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = time_range->lower;
  auVar23._4_4_ = time_range->upper;
  uVar20 = vcmpps_avx512vl(auVar28,auVar23,1);
  auVar22 = vinsertps_avx(auVar23,auVar28,0x50);
  auVar28 = vinsertps_avx(auVar28,auVar23,0x50);
  bVar5 = (bool)((byte)uVar20 & 1);
  local_b8._0_4_ = (float)((uint)bVar5 * auVar22._0_4_ | (uint)!bVar5 * auVar28._0_4_);
  bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
  local_b8._4_4_ = (uint)bVar5 * auVar22._4_4_ | (uint)!bVar5 * auVar28._4_4_;
  bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
  local_b8._8_4_ = (uint)bVar5 * auVar22._8_4_ | (uint)!bVar5 * auVar28._8_4_;
  bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
  local_b8._12_4_ = (uint)bVar5 * auVar22._12_4_ | (uint)!bVar5 * auVar28._12_4_;
  auVar41 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar42 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_178 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_188 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    uVar20 = r->_begin;
    local_198 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_1d0 = __return_storage_ptr__->end;
    if (uVar20 < r->_end) {
      auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar44 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar45 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar46 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      local_1c8 = k;
      do {
        BVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar22._8_8_ = 0;
        auVar22._0_4_ = BVar1.lower;
        auVar22._4_4_ = BVar1.upper;
        auVar22 = vmovshdup_avx(auVar22);
        fVar24 = BVar1.lower;
        fVar8 = auVar22._0_4_ - fVar24;
        uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar20);
        pBVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 vertices.items;
        if ((ulong)(uVar2 + 3) < (pBVar3->super_RawBufferView).num) {
          fVar26 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   super_Geometry.fnumTimeSegments;
          auVar22 = ZEXT416((uint)(fVar26 * ((auVar41._0_4_ - fVar24) / fVar8) * 1.0000002));
          auVar22 = vroundss_avx(auVar22,auVar22,9);
          auVar22 = vmaxss_avx(auVar43._0_16_,auVar22);
          uVar11 = (uint)auVar22._0_4_;
          auVar22 = ZEXT416((uint)(fVar26 * ((auVar42._0_4_ - fVar24) / fVar8) * 0.99999976));
          auVar22 = vroundss_avx(auVar22,auVar22,10);
          auVar22 = vminss_avx(auVar22,ZEXT416((uint)fVar26));
          uVar16 = (uint)auVar22._0_4_;
          bVar5 = uVar16 < uVar11;
          if (uVar11 <= uVar16) {
            uVar12 = (ulong)(int)uVar11;
            psVar17 = &pBVar3[uVar12].super_RawBufferView.stride;
            do {
              pcVar4 = ((RawBufferView *)(psVar17 + -2))->ptr_ofs;
              sVar19 = *psVar17;
              auVar28 = auVar44._0_16_;
              auVar22 = vandps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + sVar19 * uVar2 + 0xc)));
              if (1.844e+18 <= auVar22._0_4_) {
LAB_01f688ce:
                if (!bVar5) goto LAB_01f68d67;
                break;
              }
              lVar18 = sVar19 * (uVar2 + 1);
              auVar22 = vandps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar18 + 0xc)));
              if (1.844e+18 <= auVar22._0_4_) goto LAB_01f688ce;
              lVar21 = sVar19 * (uVar2 + 2);
              auVar22 = vandps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar21 + 0xc)));
              if (1.844e+18 <= auVar22._0_4_) goto LAB_01f688ce;
              lVar14 = sVar19 * (uVar2 + 3);
              auVar22 = vandps_avx(auVar28,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)));
              if (1.844e+18 <= auVar22._0_4_) goto LAB_01f688ce;
              auVar22 = auVar45._0_16_;
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + sVar19 * uVar2),auVar22,6);
              auVar28 = auVar46._0_16_;
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + sVar19 * uVar2),auVar28,1);
              if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01f688ce;
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar18),auVar22,6);
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar18),auVar28,1);
              if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01f688ce;
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar21),auVar22,6);
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar21),auVar28,1);
              if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01f688ce;
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar14),auVar22,6);
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar4 + lVar14),auVar28,1);
              if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01f688ce;
              uVar12 = uVar12 + 1;
              psVar17 = psVar17 + 7;
              bVar5 = (ulong)(long)(int)uVar16 < uVar12;
            } while (uVar12 <= (ulong)(long)(int)uVar16);
          }
          local_118.primID = &local_120;
          fVar8 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                  super_Geometry.time_range.lower;
          fVar25 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   super_Geometry.time_range.upper - fVar8;
          fVar37 = (auVar41._0_4_ - fVar8) / fVar25;
          fVar25 = (auVar42._0_4_ - fVar8) / fVar25;
          fVar8 = fVar26 * fVar37;
          fVar24 = fVar26 * fVar25;
          auVar23 = vroundss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),9);
          auVar49 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
          auVar22 = vmaxss_avx(auVar23,auVar43._0_16_);
          auVar28 = vminss_avx(auVar49,ZEXT416((uint)fVar26));
          iVar15 = (int)auVar22._0_4_;
          fVar38 = auVar28._0_4_;
          uVar2 = (int)auVar23._0_4_;
          if ((int)auVar23._0_4_ < 0) {
            uVar2 = 0xffffffff;
          }
          iVar13 = (int)fVar26 + 1;
          if ((int)auVar49._0_4_ < (int)fVar26 + 1) {
            iVar13 = (int)auVar49._0_4_;
          }
          local_120 = uVar20;
          local_118.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar15);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar38);
          fVar8 = fVar8 - auVar22._0_4_;
          if (iVar13 - uVar2 == 1) {
            auVar28 = ZEXT816(0) << 0x40;
            auVar22 = vmaxss_avx(ZEXT416((uint)fVar8),auVar28);
            fVar26 = auVar22._0_4_;
            fVar8 = 1.0 - fVar26;
            auVar47._0_4_ = fVar26 * local_108.m128[0];
            auVar47._4_4_ = fVar26 * local_108.m128[1];
            auVar47._8_4_ = fVar26 * local_108.m128[2];
            auVar47._12_4_ = fVar26 * local_108.m128[3];
            auVar33._4_4_ = fVar8;
            auVar33._0_4_ = fVar8;
            auVar33._8_4_ = fVar8;
            auVar33._12_4_ = fVar8;
            auVar49 = vfmadd231ps_fma(auVar47,auVar33,(undefined1  [16])local_e8);
            auVar50._0_4_ = fVar26 * local_f8._0_4_;
            auVar50._4_4_ = fVar26 * local_f8._4_4_;
            auVar50._8_4_ = fVar26 * local_f8._8_4_;
            auVar50._12_4_ = fVar26 * local_f8._12_4_;
            auVar52 = vfmadd231ps_fma(auVar50,local_d8,auVar33);
            auVar22 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar24)),auVar28);
            auVar29._0_4_ = auVar22._0_4_;
            fVar8 = 1.0 - auVar29._0_4_;
            auVar29._4_4_ = auVar29._0_4_;
            auVar29._8_4_ = auVar29._0_4_;
            auVar29._12_4_ = auVar29._0_4_;
            auVar53._0_4_ = auVar29._0_4_ * local_e8.m128[0];
            auVar53._4_4_ = auVar29._0_4_ * local_e8.m128[1];
            auVar53._8_4_ = auVar29._0_4_ * local_e8.m128[2];
            auVar53._12_4_ = auVar29._0_4_ * local_e8.m128[3];
            auVar34._4_4_ = fVar8;
            auVar34._0_4_ = fVar8;
            auVar34._8_4_ = fVar8;
            auVar34._12_4_ = fVar8;
            auVar55 = vfmadd231ps_fma(auVar53,auVar34,(undefined1  [16])local_108);
            auVar22 = vmulps_avx512vl(auVar29,local_d8);
            auVar22 = vfmadd231ps_avx512vl(auVar22,auVar34,local_f8);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar15 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar38 + -1));
            auVar22 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40);
            fVar27 = auVar22._0_4_;
            auVar48._0_4_ = fVar27 * local_58.m128[0];
            auVar48._4_4_ = fVar27 * local_58.m128[1];
            auVar48._8_4_ = fVar27 * local_58.m128[2];
            auVar48._12_4_ = fVar27 * local_58.m128[3];
            fVar8 = 1.0 - fVar27;
            auVar30._4_4_ = fVar8;
            auVar30._0_4_ = fVar8;
            auVar30._8_4_ = fVar8;
            auVar30._12_4_ = fVar8;
            auVar49 = vfmadd231ps_fma(auVar48,auVar30,(undefined1  [16])local_e8);
            auVar51._0_4_ = fVar27 * local_48;
            auVar51._4_4_ = fVar27 * fStack_44;
            auVar51._8_4_ = fVar27 * fStack_40;
            auVar51._12_4_ = fVar27 * fStack_3c;
            auVar52 = vfmadd231ps_fma(auVar51,auVar30,local_d8);
            auVar22 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar24)),ZEXT816(0) << 0x40);
            auVar31._0_4_ = auVar22._0_4_;
            fVar8 = 1.0 - auVar31._0_4_;
            auVar31._4_4_ = auVar31._0_4_;
            auVar31._8_4_ = auVar31._0_4_;
            auVar31._12_4_ = auVar31._0_4_;
            auVar54._0_4_ = auVar31._0_4_ * local_78.m128[0];
            auVar54._4_4_ = auVar31._0_4_ * local_78.m128[1];
            auVar54._8_4_ = auVar31._0_4_ * local_78.m128[2];
            auVar54._12_4_ = auVar31._0_4_ * local_78.m128[3];
            auVar35._4_4_ = fVar8;
            auVar35._0_4_ = fVar8;
            auVar35._8_4_ = fVar8;
            auVar35._12_4_ = fVar8;
            auVar55 = vfmadd231ps_fma(auVar54,auVar35,(undefined1  [16])local_108);
            auVar22 = vmulps_avx512vl(auVar31,local_68);
            auVar22 = vfmadd231ps_avx512vl(auVar22,auVar35,local_f8);
            if ((int)(uVar2 + 1) < iVar13) {
              sVar19 = (size_t)(uVar2 + 1);
              iVar13 = ~uVar2 + iVar13;
              do {
                auVar32._0_4_ = ((float)(int)sVar19 / fVar26 - fVar37) / (fVar25 - fVar37);
                fVar8 = 1.0 - auVar32._0_4_;
                auVar32._4_4_ = auVar32._0_4_;
                auVar32._8_4_ = auVar32._0_4_;
                auVar32._12_4_ = auVar32._0_4_;
                auVar39._0_4_ = auVar55._0_4_ * auVar32._0_4_;
                fVar24 = auVar55._4_4_;
                auVar39._4_4_ = fVar24 * auVar32._0_4_;
                fVar38 = auVar55._8_4_;
                auVar39._8_4_ = fVar38 * auVar32._0_4_;
                fVar27 = auVar55._12_4_;
                auVar39._12_4_ = fVar27 * auVar32._0_4_;
                auVar36._4_4_ = fVar8;
                auVar36._0_4_ = fVar8;
                auVar36._8_4_ = fVar8;
                auVar36._12_4_ = fVar8;
                auVar28 = vfmadd231ps_fma(auVar39,auVar36,auVar49);
                auVar23 = vmulps_avx512vl(auVar22,auVar32);
                local_a8 = vfmadd231ps_fma(auVar23,auVar52,auVar36);
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,sVar19);
                local_1b8 = auVar52._0_4_;
                fStack_1b4 = auVar52._4_4_;
                fStack_1b0 = auVar52._8_4_;
                fStack_1ac = auVar52._12_4_;
                local_1a8 = auVar49._0_4_;
                fStack_1a4 = auVar49._4_4_;
                fStack_1a0 = auVar49._8_4_;
                fStack_19c = auVar49._12_4_;
                auVar28 = vsubps_avx((undefined1  [16])local_98,auVar28);
                auVar49 = vsubps_avx(local_88,local_a8);
                auVar23 = vminps_avx(auVar28,ZEXT816(0) << 0x40);
                auVar28 = vmaxps_avx(auVar49,ZEXT816(0) << 0x40);
                auVar49._0_4_ = local_1a8 + auVar23._0_4_;
                auVar49._4_4_ = fStack_1a4 + auVar23._4_4_;
                auVar49._8_4_ = fStack_1a0 + auVar23._8_4_;
                auVar49._12_4_ = fStack_19c + auVar23._12_4_;
                auVar55._0_4_ = auVar55._0_4_ + auVar23._0_4_;
                auVar55._4_4_ = fVar24 + auVar23._4_4_;
                auVar55._8_4_ = fVar38 + auVar23._8_4_;
                auVar55._12_4_ = fVar27 + auVar23._12_4_;
                auVar52._0_4_ = local_1b8 + auVar28._0_4_;
                auVar52._4_4_ = fStack_1b4 + auVar28._4_4_;
                auVar52._8_4_ = fStack_1b0 + auVar28._8_4_;
                auVar52._12_4_ = fStack_1ac + auVar28._12_4_;
                auVar22 = vaddps_avx512vl(auVar22,auVar28);
                sVar19 = sVar19 + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            auVar28 = ZEXT816(0) << 0x40;
          }
          auVar43 = ZEXT1664(auVar28);
          uVar9 = vcmpps_avx512vl(auVar49,auVar52,2);
          auVar41 = ZEXT1664(local_b8);
          auVar42 = ZEXT1664(local_c8);
          auVar44 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar45 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar46 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if (((~(ushort)uVar9 & 7) == 0) &&
             (uVar9 = vcmpps_avx512vl(auVar55,auVar22,2), (~(ushort)uVar9 & 7) == 0)) {
            auVar28 = vminps_avx(auVar49,auVar55);
            aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar28,ZEXT416(geomID),0x30);
            auVar22 = vmaxps_avx512vl(auVar52,auVar22);
            aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar22,ZEXT416((uint)uVar20),0x30);
            auVar40._0_4_ = aVar6.x + aVar7.x;
            auVar40._4_4_ = aVar6.y + aVar7.y;
            auVar40._8_4_ = aVar6.z + aVar7.z;
            auVar40._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
            local_168 = vminps_avx(local_168,(undefined1  [16])aVar6);
            local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar7);
            local_188 = vminps_avx(local_188,auVar40);
            local_198 = vmaxps_avx(local_198,auVar40);
            local_1d0 = local_1d0 + 1;
            prims[local_1c8].lower.field_0.field_1 = aVar6;
            prims[local_1c8].upper.field_0.field_1 = aVar7;
            local_1c8 = local_1c8 + 1;
          }
        }
LAB_01f68d67:
        uVar20 = uVar20 + 1;
      } while (uVar20 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1d0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }